

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O3

void __thiscall UnifiedRegex::AltNode::Print(AltNode *this,DebugWriter *w,Char *litbuf)

{
  AltNode *curr;
  
  DebugWriter::PrintEOL(w,L"Alt()");
  Node::PrintAnnotations(&this->super_Node,w);
  DebugWriter::PrintEOL(w,L"{");
  DebugWriter::Indent(w);
  do {
    (*this->head->_vptr_Node[0x16])(this->head,w,litbuf);
    this = this->tail;
  } while (this != (AltNode *)0x0);
  DebugWriter::Unindent(w);
  DebugWriter::PrintEOL(w,L"}");
  return;
}

Assistant:

void AltNode::Print(DebugWriter* w, const Char* litbuf) const
    {
        w->PrintEOL(_u("Alt()"));
        PrintAnnotations(w);
        w->PrintEOL(_u("{"));
        w->Indent();
        for (const AltNode *curr = this; curr != 0; curr = curr->tail)
            curr->head->Print(w, litbuf);
        w->Unindent();
        w->PrintEOL(_u("}"));
    }